

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdSArray.h
# Opt level: O1

void __thiscall
HACD::SArray<long,_16UL>::operator=(SArray<long,_16UL> *this,SArray<long,_16UL> *rhs)

{
  ulong uVar1;
  size_t sVar2;
  long *plVar3;
  
  if (this->m_maxSize < rhs->m_size) {
    if (this->m_data != (long *)0x0) {
      operator_delete__(this->m_data);
    }
    uVar1 = rhs->m_maxSize;
    this->m_maxSize = uVar1;
    plVar3 = (long *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 << 3);
    this->m_data = plVar3;
  }
  sVar2 = rhs->m_size;
  this->m_size = sVar2;
  if (this->m_maxSize != 0x10) {
    this = (SArray<long,_16UL> *)this->m_data;
  }
  if (rhs->m_maxSize != 0x10) {
    rhs = (SArray<long,_16UL> *)rhs->m_data;
  }
  memcpy(this,rhs,sVar2 << 3);
  return;
}

Assistant:

void                    operator=(const SArray & rhs)       
                                    {
                                        if (m_maxSize < rhs.m_size)
                                        {
                                            delete [] m_data;
                                            m_maxSize = rhs.m_maxSize;
                                            m_data = new T[m_maxSize];
                                        }
                                        m_size = rhs.m_size;
                                        memcpy(Data(), rhs.Data(), m_size*sizeof(T));
                                    }